

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O3

bool __thiscall jbcoin::STPathSet::assembleAdd(STPathSet *this,STPath *base,STPathElement *tail)

{
  pointer *ppSVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer pSVar5;
  uint32_t uVar6;
  bool bVar7;
  long lVar8;
  iterator __position;
  STPath *this_00;
  byte bVar9;
  
  bVar9 = 0;
  std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::push_back(&this->value,base);
  pSVar3 = (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl
           .super__Vector_impl_data._M_finish;
  __position._M_current =
       pSVar3[-1].mPath.
       super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      pSVar3[-1].mPath.
      super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>>::
    _M_realloc_insert<jbcoin::STPathElement_const&>
              ((vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>> *)(pSVar3 + -1),
               __position,tail);
  }
  else {
    for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
      uVar6 = (tail->mAccountID).pn[0];
      (__position._M_current)->mType = tail->mType;
      ((__position._M_current)->mAccountID).pn[0] = uVar6;
      tail = (STPathElement *)((long)tail + (ulong)bVar9 * -0x10 + 8);
      __position._M_current = __position._M_current + (ulong)bVar9 * -0x10 + 8;
    }
    ppSVar1 = &pSVar3[-1].mPath.
               super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this_00 = pSVar3 + -2;
  do {
    pSVar2 = this_00 + 1;
    pSVar4 = (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pSVar2 == pSVar4) goto LAB_001b7505;
    bVar7 = STPath::operator==(this_00,(STPath *)(pSVar3 + -1));
    this_00 = this_00 + -1;
  } while (!bVar7);
  pSVar3 = (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar3 + -1;
  pSVar5 = pSVar3[-1].mPath.
           super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pSVar5 != (pointer)0x0) {
    operator_delete(pSVar5,(long)pSVar3[-1].mPath.
                                 super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar5);
  }
LAB_001b7505:
  return pSVar2 == pSVar4;
}

Assistant:

bool
STPathSet::assembleAdd(STPath const& base, STPathElement const& tail)
{ // assemble base+tail and add it to the set if it's not a duplicate
    value.push_back (base);

    std::vector<STPath>::reverse_iterator it = value.rbegin ();

    STPath& newPath = *it;
    newPath.push_back (tail);

    while (++it != value.rend ())
    {
        if (*it == newPath)
        {
            value.pop_back ();
            return false;
        }
    }
    return true;
}